

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void StdSprintf(void)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  undefined1 local_1410 [8];
  random_device _rdev;
  char buf [64];
  param_type local_40;
  uniform_int_distribution<int> _dist;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sprintf",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  std::random_device::random_device((random_device *)local_1410);
  local_40._M_a = -0x80000000;
  local_40._M_b = 0x7fffffff;
  iVar5 = 10000000;
  _dist._M_param = (param_type)std::chrono::_V2::steady_clock::now();
  do {
    uVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_40,(random_device *)local_1410,
                       &local_40);
    sprintf(_rdev.field_0.field2 + 0x1380,"%d",(ulong)uVar2);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  lVar3 = std::chrono::_V2::steady_clock::now();
  std::random_device::_M_fini();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - (long)_dist._M_param) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void StdSprintf()
{
    char buf[64];
    RANDOM_PROFILING_BEGIN("sprintf")
    sprintf(buf, PrintfFormat<number_t>(), i);
    RANDOM_PROFILING_END()
}